

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

void __thiscall VertexClustering::build(VertexClustering *this)

{
  bool bVar1;
  void *pvVar2;
  ulong uVar3;
  size_type sVar4;
  reference ppVVar5;
  size_t sVar6;
  size_type sVar7;
  reference pvVar8;
  reference piVar9;
  int *piVar10;
  iterator __x;
  pointer ppVar11;
  size_type sVar12;
  clock_t cVar13;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar14;
  iterator edgeIt;
  VCPair pair;
  int u;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  Vertex *v;
  set<int,_std::less<int>,_std::allocator<int>_> cset;
  int i_1;
  int v2;
  int v1;
  VCEdge e;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_00000168;
  VertexClustering *in_stack_00000170;
  int i;
  clock_t start;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  VertexGroup *in_stack_fffffffffffffe50;
  Vector3d *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  int a;
  VertexGroup *in_stack_fffffffffffffe90;
  _Self local_130;
  _Self local_128;
  VCPair local_11c;
  int local_114;
  _Self local_110;
  _Self local_108;
  long local_100;
  long local_f8;
  int local_bc;
  int local_b8;
  int local_b4;
  VCEdge local_b0 [2];
  Vec3d local_88 [4];
  int local_20;
  clock_t local_10;
  
  printf("start to rebuild the mesh from the clusters\n");
  local_10 = clock();
  if ((in_RDI[1] != 0) && (pvVar2 = (void *)in_RDI[1], pvVar2 != (void *)0x0)) {
    VertexGroup::~VertexGroup(in_stack_fffffffffffffe50);
    operator_delete(pvVar2);
  }
  pvVar2 = operator_new(0x4c4b410);
  VertexGroup::VertexGroup(in_stack_fffffffffffffe90);
  in_RDI[1] = (long)pvVar2;
  local_20 = 1;
  while( true ) {
    uVar3 = (ulong)local_20;
    sVar4 = std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::size
                      ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)(in_RDI + 2));
    if (sVar4 <= uVar3) break;
    ppVVar5 = std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::operator[]
                        ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)(in_RDI + 2),
                         (long)local_20);
    (*(*ppVVar5)->_vptr_VCCluster[7])();
    VCEigenToMyvec(in_stack_fffffffffffffe58);
    Vertex::Vertex((Vertex *)in_stack_fffffffffffffe50,
                   (Vec3d *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    VertexGroup::addVertex
              ((VertexGroup *)in_stack_fffffffffffffe40._M_node,
               (Vertex *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
    Vertex::~Vertex((Vertex *)in_stack_fffffffffffffe40._M_node);
    Vec3d::~Vec3d(local_88);
    std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::operator[]
              ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)(in_RDI + 2),(long)local_20);
    sVar6 = VCCluster::size((VCCluster *)0x282290);
    if (sVar6 == 0) {
      VertexGroup::delVertex
                ((VertexGroup *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    }
    local_20 = local_20 + 1;
  }
  while (sVar7 = std::queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_>::size
                           ((queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *)0x282345)
        , sVar7 != 0) {
    pvVar8 = std::queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_>::front
                       ((queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *)0x28235d);
    local_b0[0].f1 = pvVar8->f1;
    local_b0[0].f2 = pvVar8->f2;
    std::queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_>::pop
              ((queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *)0x282382);
    bVar1 = VCEdge::isBoundary(local_b0);
    if (bVar1) {
      local_b4 = (local_b0[0].f1)->cluster->id;
      local_b8 = (local_b0[0].f2)->cluster->id;
      Vertex::addNeighborVertex((Vertex *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      Vertex::addNeighborVertex((Vertex *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    }
  }
  for (local_bc = 1; local_bc <= *(int *)(*in_RDI + 80000000); local_bc = local_bc + 1) {
    if ((*(byte *)(*(long *)(*in_RDI + 0x4c4b408) + (long)local_bc) & 1) == 0) {
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)0x282469);
      local_f8 = *in_RDI + (long)local_bc * 0x50;
      local_100 = local_f8 + 0x20;
      local_108._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                      CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      local_110._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                      CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      while (bVar1 = std::operator!=(&local_108,&local_110), bVar1) {
        piVar9 = std::_Rb_tree_const_iterator<int>::operator*
                           ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffe40._M_node);
        local_114 = *piVar9;
        piVar10 = std::min<int>(&local_bc,&local_114);
        a = *piVar10;
        piVar10 = std::max<int>(&local_bc,&local_114);
        VCPair::VCPair(&local_11c,a,*piVar10);
        __x = std::
              map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
              ::find((map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
                      *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                     (key_type *)0x28256d);
        local_128._M_node = __x._M_node;
        local_130._M_node =
             (_Base_ptr)
             std::
             map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>::
             end((map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
                  *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
        bVar1 = std::operator!=(&local_128,&local_130);
        if (bVar1) {
          ppVar11 = std::_Rb_tree_iterator<std::pair<const_VCPair,_VCEdge>_>::operator->
                              ((_Rb_tree_iterator<std::pair<const_VCPair,_VCEdge>_> *)0x2825c2);
          if ((ppVar11->second).f1 != (VCFace *)0x0) {
            std::_Rb_tree_iterator<std::pair<const_VCPair,_VCEdge>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_VCPair,_VCEdge>_> *)0x2825d6);
            std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)
                       CONCAT44(a,in_stack_fffffffffffffe60),(value_type_conflict *)__x._M_node);
          }
          ppVar11 = std::_Rb_tree_iterator<std::pair<const_VCPair,_VCEdge>_>::operator->
                              ((_Rb_tree_iterator<std::pair<const_VCPair,_VCEdge>_> *)0x28264a);
          if ((ppVar11->second).f2 != (VCFace *)0x0) {
            std::_Rb_tree_iterator<std::pair<const_VCPair,_VCEdge>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_VCPair,_VCEdge>_> *)0x28265e);
            pVar14 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                CONCAT44(a,in_stack_fffffffffffffe60),
                                (value_type_conflict *)__x._M_node);
            in_stack_fffffffffffffe40 = pVar14.first._M_node;
            in_stack_fffffffffffffe3f = pVar14.second;
          }
        }
        std::_Rb_tree_const_iterator<int>::operator++
                  ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffe40._M_node);
      }
      sVar12 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2826bd);
      if (3 < sVar12) {
        localRefine(in_stack_00000170,in_stack_00000168);
      }
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2826e6);
    }
  }
  cVar13 = clock();
  printf("Done, uses %lf s for building.\n",(double)(cVar13 - local_10) / 1000000.0);
  return;
}

Assistant:

void VertexClustering::build()
{
	printf("start to rebuild the mesh from the clusters\n");
	clock_t start = clock();
	if (vGroupNew)
		delete vGroupNew;
	vGroupNew = new VertexGroup();
	for (int i = 1; i < clusters.size(); i++) {
		vGroupNew->addVertex(Vertex(VCEigenToMyvec(clusters[i]->center())));
		if (clusters[i]->size() == 0)
			vGroupNew->delVertex(i);
	}

	while(boundary.size() > 0) {
		VCEdge e = boundary.front();
		boundary.pop();
		if (e.isBoundary()) {
			int v1 = e.f1->cluster->id;
			int v2 = e.f2->cluster->id;
			vGroupNew->group[v1].addNeighborVertex(v2);
			vGroupNew->group[v2].addNeighborVertex(v1);
		}
	}
	//refine
	for (int i = 1; i <= vGroup->cntVertex; i++) {
		if (vGroup->isDeleted[i])
			continue;
		set<int> cset;
		Vertex* v = &vGroup->group[i];
		for (int u : v->neighborVertexIds) {
			VCPair pair(min(i, u), max(i, u));
			auto edgeIt = edgeMap.find(pair);
			if (edgeIt != edgeMap.end()) {
				if(edgeIt->second.f1)
					cset.insert(edgeIt->second.f1->cluster->id);
				if(edgeIt->second.f2)
					cset.insert(edgeIt->second.f2->cluster->id);
			}
		}
		if (cset.size() >= 4) {
			localRefine(cset);
		}
	}
	printf("Done, uses %lf s for building.\n", (double)(clock() - start) / CLOCKS_PER_SEC);
}